

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmt_bin_decode.c
# Opt level: O2

void mmt_buf_check_sanity(mmt_buf *buf)

{
  if (buf->len < 0x10000) {
    return;
  }
  fflush(_stdout);
  fprintf(_stderr,"buffer too long: %u\n",(ulong)buf->len);
  fflush(_stderr);
  exit(1);
}

Assistant:

void mmt_buf_check_sanity(struct mmt_buf *buf)
{
	if (buf->len < MMT_BUF_SIZE)
		return;

	fflush(stdout);
	fprintf(stderr, "buffer too long: %u\n", buf->len);
	fflush(stderr);
	exit(1);
}